

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

void __thiscall
H264StreamReader::checkPyramid
          (H264StreamReader *this,int frameNum,int *fullPicOrder,bool nextFrameFound)

{
  ostream *poVar1;
  int local_28;
  int depth;
  bool nextFrameFound_local;
  int *fullPicOrder_local;
  int frameNum_local;
  H264StreamReader *this_local;
  
  local_28 = frameNum - *fullPicOrder;
  if (3 < local_28) {
    local_28 = 3;
  }
  if (this->m_frameDepth < local_28) {
    if (nextFrameFound) {
      this->m_frameDepth = local_28;
      poVar1 = std::operator<<((ostream *)&std::cout,"B-pyramid level ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_frameDepth + -1);
      poVar1 = std::operator<<(poVar1," detected. Shift DTS to ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_frameDepth);
      poVar1 = std::operator<<(poVar1," frames");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
    else {
      *fullPicOrder = frameNum - this->m_frameDepth;
    }
  }
  return;
}

Assistant:

void H264StreamReader::checkPyramid(const int frameNum, int *fullPicOrder, const bool nextFrameFound)
{
    int depth = frameNum - *fullPicOrder;
    if (depth > 3)
        depth = 3;  // prevent large delay. It is not to be happend in normanl stream, but this protection for invalid
                    // streams.
    if (depth > m_frameDepth)
    {
        if (nextFrameFound)
        {
            m_frameDepth = depth;
            LTRACE(LT_INFO, 2,
                   "B-pyramid level " << m_frameDepth - 1 << " detected. Shift DTS to " << m_frameDepth << " frames");
        }
        else
        {
            *fullPicOrder = frameNum - m_frameDepth;  // special case for last frame
        }
    }
}